

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int joliet_allowed_char(uchar high,uchar low)

{
  undefined3 in_register_00000031;
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (int)CONCAT71(in_register_00000039,high) << 8 | CONCAT31(in_register_00000031,low);
  if ((0x1f < uVar1) &&
     ((uVar1 = uVar1 - 0x2a, 0x32 < uVar1 || ((0x4000000230021U >> ((ulong)uVar1 & 0x3f) & 1) == 0))
     )) {
    return 1;
  }
  return 0;
}

Assistant:

static inline int
joliet_allowed_char(unsigned char high, unsigned char low)
{
	int utf16 = (high << 8) | low;

	if (utf16 <= 0x001F)
		return (0);

	switch (utf16) {
	case 0x002A: /* '*' */
	case 0x002F: /* '/' */
	case 0x003A: /* ':' */
	case 0x003B: /* ';' */
	case 0x003F: /* '?' */
	case 0x005C: /* '\' */
		return (0);/* Not allowed. */
	}
	return (1);
}